

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O2

void __thiscall application::Message::Message(Message *this,wstring *user,wstring *content)

{
  std::__cxx11::wstring::wstring((wstring *)this,(wstring *)user);
  std::__cxx11::wstring::wstring((wstring *)&this->content,(wstring *)content);
  return;
}

Assistant:

Message(std::wstring user, std::wstring content)
			: user(user), content(content) {}